

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
* fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,std::__cxx11::string_const,std::__cxx11::string,char_const*>
            (uint *args,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,char **args_3)

{
  longlong lVar1;
  size_t sVar2;
  size_t sVar3;
  undefined4 *in_RSI;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  *in_RDI;
  longlong *in_R8;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_char_2;
  bool formattable_3;
  bool formattable_pointer_3;
  bool formattable_char_3;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  undefined1 local_194;
  undefined1 local_193;
  undefined1 local_192;
  undefined1 local_191;
  longlong local_188;
  size_t local_180;
  undefined4 local_16c;
  undefined1 *local_168;
  undefined4 local_15c;
  longlong *local_158;
  undefined1 local_149;
  char *local_148;
  size_t local_140;
  undefined1 local_133;
  undefined1 local_132;
  undefined1 local_131;
  char *local_128 [4];
  undefined1 *local_108;
  basic_string_view<char> local_100;
  char **local_f0;
  basic_string_view<char> local_e8 [2];
  size_t local_c0;
  undefined1 local_69;
  char *local_68;
  size_t local_60;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  char *local_48 [3];
  undefined1 *local_30;
  basic_string_view<char> local_28;
  char **local_18;
  basic_string_view<char> local_10;
  
  local_191 = 1;
  local_192 = 1;
  local_193 = 1;
  local_16c = *in_RSI;
  local_168 = &local_194;
  local_158 = &local_188;
  local_188._0_4_ = local_16c;
  local_51 = 1;
  local_52 = 1;
  local_53 = 1;
  local_30 = &local_69;
  local_15c = local_16c;
  local_28 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x254d49);
  local_68 = local_28.data_;
  local_60 = local_28.size_;
  local_10.data_ = local_28.data_;
  local_10.size_ = local_28.size_;
  local_18 = local_48;
  local_48[0] = basic_string_view<char>::data(&local_10);
  sVar2 = basic_string_view<char>::size(&local_10);
  local_131 = 1;
  local_132 = 1;
  local_133 = 1;
  local_108 = &local_149;
  local_100 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x254e56);
  local_148 = local_100.data_;
  local_140 = local_100.size_;
  local_e8[0].data_ = local_100.data_;
  local_e8[0].size_ = local_100.size_;
  local_f0 = local_128;
  local_128[0] = basic_string_view<char>::data(local_e8);
  sVar3 = basic_string_view<char>::size(local_e8);
  lVar1 = *in_R8;
  (in_RDI->data_).args_[0].field_0.long_long_value = local_188;
  (in_RDI->data_).args_[0].field_0.string.size = local_180;
  (in_RDI->data_).args_[1].field_0.string.data = local_48[0];
  (in_RDI->data_).args_[1].field_0.string.size = sVar2;
  (in_RDI->data_).args_[2].field_0.string.data = local_128[0];
  (in_RDI->data_).args_[2].field_0.string.size = sVar3;
  (in_RDI->data_).args_[3].field_0.long_long_value = lVar1;
  (in_RDI->data_).args_[3].field_0.string.size = local_c0;
  return in_RDI;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}